

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u32 *in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint n;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_14;
  
  bVar1 = readOp<(moira::Mode)0,(moira::Size)4,0ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe0) &
                              0x7ffffffff),(int)((ulong)in_RDI >> 0x20),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (bVar1) {
    bVar1 = NBIT<(moira::Size)2>((ulong)(local_14 >> 0x10));
    (in_RDI->reg).sr.n = bVar1;
    bVar1 = ZERO<(moira::Size)2>((ulong)(local_14 >> 0x10));
    n = in_stack_ffffffffffffffd4 & 0xffffff;
    if (bVar1) {
      n = CONCAT13((in_RDI->reg).sr.z,(int3)in_stack_ffffffffffffffd4);
    }
    (in_RDI->reg).sr.z = (bool)((byte)(n >> 0x18) & 1);
    bVar1 = writeOp<(moira::Mode)5,(moira::Size)4,0ul>(in_RDI,n,in_stack_ffffffffffffffd0);
    if (bVar1) {
      prefetch<4ul>((Moira *)CONCAT44(n,in_stack_ffffffffffffffd0));
      bVar1 = NBIT<(moira::Size)4>((ulong)local_14);
      (in_RDI->reg).sr.n = bVar1;
      bVar1 = ZERO<(moira::Size)4>((ulong)local_14);
      (in_RDI->reg).sr.z = bVar1;
      (in_RDI->reg).sr.v = false;
      (in_RDI->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}